

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unpack.c
# Opt level: O0

int read_config_info(WavpackContext *wpc,WavpackMetadata *wpmd)

{
  byte *pbVar1;
  uchar *byteptr;
  int bytecnt;
  WavpackMetadata *wpmd_local;
  WavpackContext *wpc_local;
  
  pbVar1 = (byte *)wpmd->data;
  if (2 < wpmd->byte_length) {
    (wpc->config).flags = (wpc->config).flags & 0xff;
    (wpc->config).flags = (uint)*pbVar1 << 8 | (wpc->config).flags;
    (wpc->config).flags = (uint)pbVar1[1] << 0x10 | (wpc->config).flags;
    (wpc->config).flags = (uint)pbVar1[2] << 0x18 | (wpc->config).flags;
  }
  return 1;
}

Assistant:

int read_config_info (WavpackContext *wpc, WavpackMetadata *wpmd)
{
    int bytecnt = wpmd->byte_length;
    uchar *byteptr = wpmd->data;

    if (bytecnt >= 3) {
        wpc->config.flags &= 0xff;
        wpc->config.flags |= (int32_t) *byteptr++ << 8;
        wpc->config.flags |= (int32_t) *byteptr++ << 16;
        wpc->config.flags |= (int32_t) *byteptr << 24;
    }

    return TRUE;
}